

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall
duckdb::Node::MergeLeafNodes(Node *this,ART *art,Node *l_node,Node *r_node,uint8_t *byte)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = GetNextByte(r_node,art,byte);
    if (!bVar1) break;
    InsertChild(art,l_node,*byte,(Node)0x0);
    if (*byte == 0xff) break;
    *byte = *byte + '\x01';
  }
  Free(art,r_node);
  return;
}

Assistant:

void Node::MergeLeafNodes(ART &art, Node &l_node, Node &r_node, uint8_t &byte) {
	// Merge N7, N15, N256 leaf nodes.
	D_ASSERT(l_node.IsLeafNode() && r_node.IsLeafNode());
	D_ASSERT(l_node.GetGateStatus() == GateStatus::GATE_NOT_SET);
	D_ASSERT(r_node.GetGateStatus() == GateStatus::GATE_NOT_SET);

	auto has_next = r_node.GetNextByte(art, byte);
	while (has_next) {
		// Row IDs are always unique.
		Node::InsertChild(art, l_node, byte);
		if (byte == NumericLimits<uint8_t>::Maximum()) {
			break;
		}
		byte++;
		has_next = r_node.GetNextByte(art, byte);
	}

	Node::Free(art, r_node);
}